

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::SwapPositionsInSEL(Clipper *this,TEdge *Edge1,TEdge *Edge2)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *Next;
  TEdge *pTVar3;
  TEdge *pTVar4;
  
  pTVar1 = Edge1->NextInSEL;
  if ((pTVar1 == (TEdge *)0x0) && (Edge1->PrevInSEL == (TEdge *)0x0)) {
    return;
  }
  pTVar2 = Edge2->NextInSEL;
  if (pTVar2 == (TEdge *)0x0) {
    pTVar4 = Edge2->PrevInSEL;
    if (pTVar4 == (TEdge *)0x0) {
      return;
    }
    if (pTVar1 == Edge2) goto LAB_0027d31e;
    pTVar3 = Edge1->PrevInSEL;
    Edge1->NextInSEL = (TEdge *)0x0;
    Edge1->PrevInSEL = pTVar4;
LAB_0027d2f5:
    pTVar4->NextInSEL = Edge1;
  }
  else {
    if (pTVar1 == Edge2) {
      pTVar2->PrevInSEL = Edge1;
LAB_0027d31e:
      pTVar1 = Edge1->PrevInSEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->NextInSEL = Edge2;
      }
      Edge2->PrevInSEL = pTVar1;
      Edge2->NextInSEL = Edge1;
      Edge1->PrevInSEL = Edge2;
      Edge1->NextInSEL = pTVar2;
      goto LAB_0027d378;
    }
    if (pTVar2 == Edge1) {
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->PrevInSEL = Edge2;
      }
      pTVar2 = Edge2->PrevInSEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->NextInSEL = Edge1;
      }
      Edge1->PrevInSEL = pTVar2;
      Edge1->NextInSEL = Edge2;
      Edge2->PrevInSEL = Edge1;
      Edge2->NextInSEL = pTVar1;
      goto LAB_0027d378;
    }
    pTVar3 = Edge1->PrevInSEL;
    Edge1->NextInSEL = pTVar2;
    pTVar2->PrevInSEL = Edge1;
    pTVar4 = Edge2->PrevInSEL;
    Edge1->PrevInSEL = pTVar4;
    if (pTVar4 != (TEdge *)0x0) goto LAB_0027d2f5;
  }
  Edge2->NextInSEL = pTVar1;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar1->PrevInSEL = Edge2;
  }
  Edge2->PrevInSEL = pTVar3;
  if (pTVar3 != (TEdge *)0x0) {
    pTVar3->NextInSEL = Edge2;
  }
LAB_0027d378:
  if ((Edge1->PrevInSEL != (TEdge *)0x0) && (Edge1 = Edge2, Edge2->PrevInSEL != (TEdge *)0x0)) {
    return;
  }
  this->m_SortedEdges = Edge1;
  return;
}

Assistant:

void Clipper::SwapPositionsInSEL(TEdge *Edge1, TEdge *Edge2)
{
  if(  !( Edge1->NextInSEL ) &&  !( Edge1->PrevInSEL ) ) return;
  if(  !( Edge2->NextInSEL ) &&  !( Edge2->PrevInSEL ) ) return;

  if(  Edge1->NextInSEL == Edge2 )
  {
    TEdge* Next = Edge2->NextInSEL;
    if( Next ) Next->PrevInSEL = Edge1;
    TEdge* Prev = Edge1->PrevInSEL;
    if( Prev ) Prev->NextInSEL = Edge2;
    Edge2->PrevInSEL = Prev;
    Edge2->NextInSEL = Edge1;
    Edge1->PrevInSEL = Edge2;
    Edge1->NextInSEL = Next;
  }
  else if(  Edge2->NextInSEL == Edge1 )
  {
    TEdge* Next = Edge1->NextInSEL;
    if( Next ) Next->PrevInSEL = Edge2;
    TEdge* Prev = Edge2->PrevInSEL;
    if( Prev ) Prev->NextInSEL = Edge1;
    Edge1->PrevInSEL = Prev;
    Edge1->NextInSEL = Edge2;
    Edge2->PrevInSEL = Edge1;
    Edge2->NextInSEL = Next;
  }
  else
  {
    TEdge* Next = Edge1->NextInSEL;
    TEdge* Prev = Edge1->PrevInSEL;
    Edge1->NextInSEL = Edge2->NextInSEL;
    if( Edge1->NextInSEL ) Edge1->NextInSEL->PrevInSEL = Edge1;
    Edge1->PrevInSEL = Edge2->PrevInSEL;
    if( Edge1->PrevInSEL ) Edge1->PrevInSEL->NextInSEL = Edge1;
    Edge2->NextInSEL = Next;
    if( Edge2->NextInSEL ) Edge2->NextInSEL->PrevInSEL = Edge2;
    Edge2->PrevInSEL = Prev;
    if( Edge2->PrevInSEL ) Edge2->PrevInSEL->NextInSEL = Edge2;
  }

  if( !Edge1->PrevInSEL ) m_SortedEdges = Edge1;
  else if( !Edge2->PrevInSEL ) m_SortedEdges = Edge2;
}